

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O0

void __thiscall StatAggregator::~StatAggregator(StatAggregator *this)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  int i;
  stat_history_t *in_stack_ffffffffffffffc0;
  int local_c;
  
  for (local_c = 0; local_c < (int)in_RDI[1]; local_c = local_c + 1) {
    lVar1 = *(long *)(*in_RDI + (long)local_c * 8);
    if (lVar1 != 0) {
      for (lVar2 = lVar1 + *(long *)(lVar1 + -8) * 0x38; lVar1 != lVar2; lVar2 = lVar2 + -0x38) {
        stat_history_t::~stat_history_t(in_stack_ffffffffffffffc0);
      }
      operator_delete__((void *)(lVar1 + -8));
    }
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  return;
}

Assistant:

StatAggregator::~StatAggregator() {

    for (int i = 0; i < num_stats; ++i) {
        delete[] t_stats[i];
    }
    delete[] t_stats;
}